

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer_index.h
# Opt level: O1

void __thiscall
BufferIndex<double,_long>::Buffer::range_query
          (Buffer *this,double lower_bound,double upper_bound,
          vector<std::pair<double,_long>,_std::allocator<std::pair<double,_long>_>_> *answers)

{
  ulong uVar1;
  long *__args_1;
  
  if (this->number != 0) {
    __args_1 = this->payloads;
    uVar1 = 0;
    do {
      if (lower_bound <= (double)__args_1[-0x800]) {
        while( true ) {
          if (this->number <= uVar1) {
            return;
          }
          if (upper_bound < (double)__args_1[-0x800]) break;
          std::vector<std::pair<double,long>,std::allocator<std::pair<double,long>>>::
          emplace_back<double_const&,long_const&>
                    ((vector<std::pair<double,long>,std::allocator<std::pair<double,long>>> *)
                     answers,(double *)(__args_1 + -0x800),__args_1);
          uVar1 = uVar1 + 1;
          __args_1 = __args_1 + 1;
        }
        return;
      }
      uVar1 = uVar1 + 1;
      __args_1 = __args_1 + 1;
    } while (this->number != uVar1);
  }
  return;
}

Assistant:

void range_query(K lower_bound, K upper_bound, std::vector<std::pair<K, P>>& answers) const {
        for(size_t i = 0; i < number; i++) {
            if (!less_than(keys[i], lower_bound)) {
                while (i < number && !greater_than(keys[i], upper_bound)) {
                    answers.emplace_back(keys[i], payloads[i]);
                    i++;
                }
                return;
            }
        }
    }